

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

Expression *
slang::ast::ForeachLoopStatement::buildLoopDims
          (ForeachLoopListSyntax *loopList,ASTContext *context,
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *dims)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  TempVarSymbol *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  Symbol *pSVar6;
  _Storage<slang::ConstantRange,_true> _Var7;
  Type *pTVar8;
  size_t __n;
  Diagnostic *pDVar9;
  Type **ppTVar10;
  IteratorSymbol *pIVar11;
  Type *this_00;
  DiagCode code;
  ulong uVar12;
  long lVar13;
  SourceRange SVar14;
  string_view name;
  Token idName;
  LoopDim local_a8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_90;
  ulong local_88;
  Compilation *local_80;
  Token local_78;
  Type **local_68;
  Type **local_60;
  Symbol *local_58;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_50;
  Type *local_48;
  ulong local_40;
  SourceLocation local_38;
  Expression *this;
  
  local_80 = ((context->scope).ptr)->compilation;
  iVar4 = Expression::bind((int)(loopList->arrayName).ptr,(sockaddr *)context,0);
  this = (Expression *)CONCAT44(extraout_var,iVar4);
  bVar3 = Expression::bad(this);
  if (bVar3) {
    uVar12 = (loopList->loopVariables).elements._M_extent._M_extent_value + 1;
    if (1 < uVar12) {
      uVar12 = uVar12 >> 1;
      lVar13 = 0;
      do {
        ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((loopList->loopVariables).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar13));
        pSVar1 = *ppSVar5;
        if (pSVar1->kind == IdentifierName) {
          local_78._0_8_ = *(undefined8 *)(pSVar1 + 1);
          local_78.info = (Info *)pSVar1[1].parent;
          local_a8._0_16_ = parsing::Token::valueText(&local_78);
          local_38 = parsing::Token::location(&local_78);
          local_a8.loopVar =
               BumpAllocator::
               emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                         (&local_80->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,&local_38,
                          local_80->errorType,local_80->errorType);
          pTVar2 = context->firstTempVar;
          context->firstTempVar = &(local_a8.loopVar)->super_TempVarSymbol;
          ((local_a8.loopVar)->super_TempVarSymbol).nextTemp = pTVar2;
          local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = false;
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
          emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,&local_a8);
        }
        lVar13 = lVar13 + 0x30;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  else {
    this_00 = (this->type).ptr;
    pSVar6 = Expression::getSymbolReference(this,true);
    if ((pSVar6 != (Symbol *)0x0) && (bVar3 = Type::isIterable(this_00), bVar3)) {
      uVar12 = (loopList->loopVariables).elements._M_extent._M_extent_value + 1;
      if (uVar12 < 2) {
        return this;
      }
      uVar12 = uVar12 >> 1;
      local_60 = &local_80->intType;
      local_68 = &local_80->errorType;
      lVar13 = 0;
      local_88 = 0;
      local_58 = pSVar6;
      do {
        local_40 = uVar12;
        ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((loopList->loopVariables).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar13));
        if (this_00 == (Type *)0x0) {
LAB_00438690:
          SVar14 = slang::syntax::SyntaxNode::sourceRange
                             (&(loopList->loopVariables).super_SyntaxListBase.super_SyntaxNode);
          pDVar9 = ASTContext::addDiag(context,(DiagCode)0x4e0008,SVar14);
          ast::operator<<(pDVar9,(this->type).ptr);
          return (Expression *)0x0;
        }
        local_90 = *ppSVar5;
        pTVar8 = this_00->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(this_00);
          pTVar8 = this_00->canonical;
        }
        if ((pTVar8->super_Symbol).kind == ScalarType) goto LAB_00438690;
        bVar3 = Type::hasFixedRange(this_00);
        if (bVar3) {
          _Var7._M_value = Type::getFixedRange(this_00);
          local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = true;
          local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value = _Var7._M_value;
          local_a8.loopVar = (IteratorSymbol *)0x0;
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
          emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,&local_a8);
        }
        else {
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>(dims);
        }
        pTVar8 = Type::getArrayElementType(this_00);
        uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
        if (local_90->kind != EmptyIdentifierName) {
          local_50 = local_90 + 1;
          local_48 = pTVar8;
          local_a8._0_16_ = parsing::Token::valueText((Token *)local_50);
          __n = local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_payload;
          if (((~(byte)local_88 |
               dims->data_[dims->len - 1].range.
               super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_engaged) & 1) == 0) {
            SVar14 = slang::syntax::SyntaxNode::sourceRange(local_90);
            code.subsystem = Statements;
            code.code = 0x1a;
LAB_004386e9:
            pDVar9 = ASTContext::addDiag(context,code,SVar14);
            Diagnostic::operator<<(pDVar9,(string_view)local_a8._0_16_);
            return (Expression *)0x0;
          }
          if ((__n == (pSVar6->name)._M_len) &&
             ((__n == 0 || (iVar4 = bcmp(local_a8._8_8_,(pSVar6->name)._M_str,__n), iVar4 == 0)))) {
            SVar14 = slang::syntax::SyntaxNode::sourceRange(local_90);
            code.subsystem = Statements;
            code.code = 0x2b;
            goto LAB_004386e9;
          }
          pTVar8 = this_00->canonical;
          if (pTVar8 == (Type *)0x0) {
            Type::resolveCanonical(this_00);
            pTVar8 = this_00->canonical;
          }
          ppTVar10 = local_60;
          if ((pTVar8->super_Symbol).kind == AssociativeArrayType) {
            pTVar8 = Type::getAssociativeIndexType(this_00);
            if (pTVar8 == (Type *)0x0) {
              SVar14 = slang::syntax::SyntaxNode::sourceRange(local_90);
              pDVar9 = ASTContext::addDiag(context,(DiagCode)0x1b0008,SVar14);
              SVar14 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)(loopList->arrayName).ptr);
              Diagnostic::operator<<(pDVar9,SVar14);
              ppTVar10 = local_68;
              goto LAB_004385e4;
            }
          }
          else {
LAB_004385e4:
            pTVar8 = *ppTVar10;
          }
          local_78._0_8_ = parsing::Token::location((Token *)local_50);
          pIVar11 = BumpAllocator::
                    emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                              (&local_80->super_BumpAllocator,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,
                               (SourceLocation *)&local_78,this_00,pTVar8);
          pTVar2 = context->firstTempVar;
          context->firstTempVar = &pIVar11->super_TempVarSymbol;
          (pIVar11->super_TempVarSymbol).nextTemp = pTVar2;
          dims->data_[dims->len - 1].loopVar = pIVar11;
          uVar12 = local_88 & 0xffffffff;
          pTVar8 = local_48;
          pSVar6 = local_58;
        }
        lVar13 = lVar13 + 0x30;
        local_88 = uVar12 & 0xffffffff;
        uVar12 = local_40 - 1;
        this_00 = pTVar8;
        if (uVar12 == 0) {
          return this;
        }
      } while( true );
    }
    ASTContext::addDiag(context,(DiagCode)0x300008,this->sourceRange);
  }
  return (Expression *)0x0;
}

Assistant:

const Expression* ForeachLoopStatement::buildLoopDims(const ForeachLoopListSyntax& loopList,
                                                      ASTContext& context,
                                                      SmallVectorBase<LoopDim>& dims) {
    // Find the array over which we are looping. Make sure it's actually iterable:
    // - Must be a referenceable variable, class property, etc.
    // - Type can be:
    //    - Any kind of array
    //    - Any multi-dimensional integral type
    //    - A string
    auto& comp = context.getCompilation();
    auto& arrayRef = Expression::bind(*loopList.arrayName, context);
    if (arrayRef.bad()) {
        // Create placeholder iterator symbols to prevent downstream errors.
        for (auto loopVar : loopList.loopVariables) {
            if (loopVar->kind == SyntaxKind::IdentifierName) {
                auto idName = loopVar->as<IdentifierNameSyntax>().identifier;
                auto it = comp.emplace<IteratorSymbol>(idName.valueText(), idName.location(),
                                                       comp.getErrorType(), comp.getErrorType());
                it->nextTemp = std::exchange(context.firstTempVar, it);
                dims.push_back({std::nullopt, it});
            }
        }
        return nullptr;
    }

    const Type* type = arrayRef.type;
    auto arraySym = arrayRef.getSymbolReference();
    if (!arraySym || !type->isIterable()) {
        context.addDiag(diag::NotAnArray, arrayRef.sourceRange);
        return nullptr;
    }

    // Build iterator symbols for each loop variable.
    bool skippedAny = false;
    for (auto loopVar : loopList.loopVariables) {
        // If type is null, we've run out of dimensions so there were too many
        // loop variables supplied.
        if (!type || type->isScalar()) {
            context.addDiag(diag::TooManyForeachVars, loopList.loopVariables.sourceRange())
                << *arrayRef.type;
            return nullptr;
        }

        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        const Type& currType = *type;
        type = type->getArrayElementType();

        // Empty iterator names indicate that we skip this dimension.
        if (loopVar->kind == SyntaxKind::EmptyIdentifierName) {
            skippedAny = true;
            continue;
        }

        auto& idName = loopVar->as<IdentifierNameSyntax>();
        std::string_view name = idName.identifier.valueText();

        // If we previously had skipped dimensions this one can't be dynamically
        // sized (there would be no way to reach it during iteration).
        if (!dims.back().range && skippedAny) {
            context.addDiag(diag::ForeachDynamicDimAfterSkipped, idName.sourceRange()) << name;
            return nullptr;
        }

        if (name == arraySym->name) {
            context.addDiag(diag::LoopVarShadowsArray, loopVar->sourceRange()) << name;
            return nullptr;
        }

        // The type of the iterator is typically an int, unless this dimension
        // is an associative array in which case it's the index type.
        const Type* indexType;
        if (currType.isAssociativeArray()) {
            indexType = currType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::ForeachWildcardIndex, loopVar->sourceRange())
                    << loopList.arrayName->sourceRange();
                indexType = &comp.getErrorType();
            }
        }
        else {
            indexType = &comp.getIntType();
        }

        // Build the iterator variable and hook it up to our new context's
        // linked list of iterators.
        auto it = comp.emplace<IteratorSymbol>(name, idName.identifier.location(), currType,
                                               *indexType);
        it->nextTemp = std::exchange(context.firstTempVar, it);
        dims.back().loopVar = it;
    }

    return &arrayRef;
}